

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

string * Json::valueToString_abi_cxx11_(double value)

{
  bool bVar1;
  string *in_RDI;
  double in_XMM0_Qa;
  int len;
  char buffer [32];
  allocator local_3d;
  int local_3c;
  char local_38 [40];
  double local_10;
  
  local_3c = 0xffffffff;
  local_10 = in_XMM0_Qa;
  bVar1 = std::isfinite(in_XMM0_Qa);
  if (bVar1) {
    local_3c = snprintf(local_38,0x20,"%.17g",local_10);
  }
  else if (NAN(local_10)) {
    local_3c = snprintf(local_38,0x20,"null");
  }
  else if (0.0 <= local_10) {
    local_3c = snprintf(local_38,0x20,"1e+9999");
  }
  else {
    local_3c = snprintf(local_38,0x20,"-1e+9999");
  }
  fixNumericLocale(local_38,local_38 + local_3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_38,&local_3d);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d);
  return in_RDI;
}

Assistant:

std::string valueToString(double value) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[32];
  int len = -1;

// Print into the buffer. We need not request the alternative representation
// that always has a decimal point because JSON doesn't distingish the
// concepts of reals and integers.
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with
                                                      // visual studio 2005 to
                                                      // avoid warning.
#if defined(WINCE)
  len = _snprintf(buffer, sizeof(buffer), "%.17g", value);
#else
  len = sprintf_s(buffer, sizeof(buffer), "%.17g", value);
#endif
#else
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), "%.17g", value);
  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), "1e+9999");
    }
    // For those, we do not need to call fixNumLoc, but it is fast.
  }
#endif
  assert(len >= 0);
  fixNumericLocale(buffer, buffer + len);
  return buffer;
}